

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test_utils.hpp
# Opt level: O3

void __thiscall
unodb::test::detail::
do_assert_result_eq<unodb::olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>
          (detail *this,
          olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *db,
          key_type key,value_view expected,char *file,int line)

{
  __extent_storage<18446744073709551615UL> message;
  value_view expected_00;
  ostringstream local_1f0 [8];
  ostringstream msg;
  ios_base local_180 [264];
  pointer local_78;
  get_result *local_70;
  undefined1 local_68 [8];
  get_result result;
  AssertHelper local_48;
  Message local_40;
  ScopedTrace local_31 [8];
  ScopedTrace trace;
  
  local_78 = expected._M_ptr;
  local_70 = (get_result *)key;
  std::__cxx11::ostringstream::ostringstream(local_1f0);
  unodb::detail::dump_key<unsigned_long>((ostream *)local_1f0,(unsigned_long)db);
  std::__cxx11::stringbuf::str();
  message._M_extent_value = (size_t)local_68;
  testing::ScopedTrace::ScopedTrace
            (local_31,(char *)expected._M_extent._M_extent_value._M_extent_value,(int)file,
             (string *)message._M_extent_value);
  if (local_68 !=
      (undefined1  [8])
      ((long)&result.super__Optional_base<unodb::qsbr_ptr_span<const_std::byte>,_false,_false>.
              _M_payload.
              super__Optional_payload<unodb::qsbr_ptr_span<const_std::byte>,_true,_false,_false>.
              super__Optional_payload_base<unodb::qsbr_ptr_span<const_std::byte>_>._M_payload + 8))
  {
    operator_delete((void *)local_68,
                    CONCAT71(result.
                             super__Optional_base<unodb::qsbr_ptr_span<const_std::byte>,_false,_false>
                             ._M_payload.
                             super__Optional_payload<unodb::qsbr_ptr_span<const_std::byte>,_true,_false,_false>
                             .super__Optional_payload_base<unodb::qsbr_ptr_span<const_std::byte>_>.
                             _M_payload._M_value.length._1_7_,
                             result.
                             super__Optional_base<unodb::qsbr_ptr_span<const_std::byte>,_false,_false>
                             ._M_payload.
                             super__Optional_payload<unodb::qsbr_ptr_span<const_std::byte>,_true,_false,_false>
                             .super__Optional_payload_base<unodb::qsbr_ptr_span<const_std::byte>_>.
                             _M_payload.field2[8]) + 1);
  }
  olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::get_internal
            ((get_result *)local_68,
             (olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *)this,
             (art_key_type)
             ((ulong)db >> 0x38 | ((ulong)db & 0xff000000000000) >> 0x28 |
              ((ulong)db & 0xff0000000000) >> 0x18 | ((ulong)db & 0xff00000000) >> 8 |
              ((ulong)db & 0xff000000) << 8 | ((ulong)db & 0xff0000) << 0x18 |
              ((ulong)db & 0xff00) << 0x28 | (long)db << 0x38));
  if (result.super__Optional_base<unodb::qsbr_ptr_span<const_std::byte>,_false,_false>._M_payload.
      super__Optional_payload<unodb::qsbr_ptr_span<const_std::byte>,_true,_false,_false>.
      super__Optional_payload_base<unodb::qsbr_ptr_span<const_std::byte>_>._M_payload.field2[8] ==
      '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"db.get did not find ",0x14);
    unodb::detail::dump_key<unsigned_long>((ostream *)&std::cerr,(unsigned_long)db);
    local_40.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,(char *)&local_40,1);
    olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::dump
              ((olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *)this,
               (ostream *)&std::cerr);
    testing::Message::Message(&local_40);
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/db_test_utils.hpp"
               ,0x80,"Failed");
    testing::internal::AssertHelper::operator=(&local_48,&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if ((long *)CONCAT71(local_40.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._1_7_,
                         local_40.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_40.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._1_7_,
                                     local_40.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_1_) + 8))();
    }
  }
  else {
    expected_00._M_extent._M_extent_value = message._M_extent_value;
    expected_00._M_ptr = local_78;
    assert_value_eq<unodb::olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>
              ((detail *)local_68,local_70,expected_00);
  }
  if (result.super__Optional_base<unodb::qsbr_ptr_span<const_std::byte>,_false,_false>._M_payload.
      super__Optional_payload<unodb::qsbr_ptr_span<const_std::byte>,_true,_false,_false>.
      super__Optional_payload_base<unodb::qsbr_ptr_span<const_std::byte>_>._M_payload.field2[8] ==
      '\x01') {
    result.super__Optional_base<unodb::qsbr_ptr_span<const_std::byte>,_false,_false>._M_payload.
    super__Optional_payload<unodb::qsbr_ptr_span<const_std::byte>,_true,_false,_false>.
    super__Optional_payload_base<unodb::qsbr_ptr_span<const_std::byte>_>._M_payload.field2[8] = 0;
    unodb::detail::qsbr_ptr_base::unregister_active_ptr((void *)local_68);
  }
  testing::ScopedTrace::~ScopedTrace(local_31);
  std::__cxx11::ostringstream::~ostringstream(local_1f0);
  std::ios_base::~ios_base(local_180);
  return;
}

Assistant:

void do_assert_result_eq(const Db &db, typename Db::key_type key,
                         unodb::value_view expected, const char *file,
                         int line) {
  std::ostringstream msg;
  unodb::detail::dump_key(msg, key);
  const testing::ScopedTrace trace(file, line, msg.str());
  const auto result = db.get(key);
  if (!Db::key_found(result)) {
    // LCOV_EXCL_START
    std::cerr << "db.get did not find ";
    unodb::detail::dump_key(std::cerr, key);
    std::cerr << '\n';
    db.dump(std::cerr);
    FAIL();
    // LCOV_EXCL_STOP
  }
  assert_value_eq<Db>(result, expected);
}